

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall MatroskaDemuxer::matroska_parse_index(MatroskaDemuxer *this)

{
  int *levelUp;
  pointer *ppMVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  uint32_t id;
  uint32_t id_1;
  MatroskaDemuxIndex idx;
  uint32_t local_64;
  int16_t local_60;
  undefined2 uStack_5e;
  undefined4 uStack_5c;
  MatroskaDemuxIndex local_58;
  vector<MatroskaDemuxer::MatroskaDemuxIndex,std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>>
  *local_38;
  
  local_58.pos = 0;
  local_58.track = 0;
  local_58._10_6_ = 0;
  local_58.time = 0;
  levelUp = &this->level_up;
  local_38 = (vector<MatroskaDemuxer::MatroskaDemuxIndex,std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>>
              *)&this->indexes;
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = ebml_read_element_id(this,(uint32_t *)&local_60,levelUp);
    local_64 = 0;
    if (-1 < iVar2) {
      local_64 = CONCAT22(uStack_5e,local_60);
    }
    if (local_64 == 0) {
      return -1;
    }
    iVar3 = *levelUp;
    if (iVar3 != 0) {
      iVar2 = 0;
      break;
    }
    if (((local_64 == 0xec) || (local_64 == 0xbf)) || (local_64 != 0xbb)) {
      iVar2 = ebml_read_skip(this);
    }
    else {
      iVar2 = ebml_read_master(this,&local_64);
      if (-1 < iVar2) {
        local_58.pos = 0xffffffffffffffff;
        local_58.time = 0xffffffffffffffff;
        local_58.track = -1;
        iVar2 = 0;
        do {
          if (iVar2 != 0) goto LAB_0019b639;
          iVar2 = ebml_read_element_id(this,(uint32_t *)&local_60,levelUp);
          local_64 = 0;
          if (-1 < iVar2) {
            local_64 = CONCAT22(uStack_5e,local_60);
          }
          if (local_64 == 0) {
            iVar2 = -1;
            goto LAB_0019b639;
          }
          iVar3 = *levelUp;
          if (iVar3 != 0) {
            iVar2 = 0;
            break;
          }
          if ((int)local_64 < 0xbf) {
            if (local_64 == 0xb3) {
              iVar2 = ebml_read_uint(this,&local_64,(int64_t *)&local_60);
              if (-1 < iVar2) {
                local_58.time = this->time_scale * CONCAT44(uStack_5c,CONCAT22(uStack_5e,local_60));
              }
            }
            else {
              if (local_64 != 0xb7) goto LAB_0019b4f6;
              iVar2 = ebml_read_master(this,&local_64);
              do {
                if (iVar2 != 0) goto LAB_0019b501;
                iVar2 = ebml_read_element_id(this,(uint32_t *)&local_60,levelUp);
                local_64 = 0;
                if (-1 < iVar2) {
                  local_64 = CONCAT22(uStack_5e,local_60);
                }
                if (local_64 == 0) {
                  iVar2 = -1;
                  goto LAB_0019b501;
                }
                if (*levelUp != 0) {
                  *levelUp = *levelUp + -1;
                  iVar2 = 0;
                  goto LAB_0019b501;
                }
                if ((int)local_64 < 0xf1) {
LAB_0019b5d4:
                  iVar2 = ebml_read_skip(this);
                }
                else if (local_64 == 0xf1) {
                  iVar2 = ebml_read_uint(this,&local_64,(int64_t *)&local_60);
                  if (-1 < iVar2) {
                    local_58.pos = this->segment_start +
                                   CONCAT44(uStack_5c,CONCAT22(uStack_5e,local_60));
                  }
                }
                else {
                  if (local_64 != 0xf7) goto LAB_0019b5d4;
                  iVar2 = ebml_read_uint(this,&local_64,(int64_t *)&local_60);
                  if (-1 < iVar2) {
                    local_58.track = local_60;
                  }
                }
              } while (*levelUp == 0);
              *levelUp = *levelUp + -1;
            }
          }
          else {
LAB_0019b4f6:
            iVar2 = ebml_read_skip(this);
          }
LAB_0019b501:
          iVar3 = *levelUp;
        } while (iVar3 == 0);
        *levelUp = iVar3 + -1;
LAB_0019b639:
        if (((local_58.pos != 0xffffffffffffffff) && (local_58.time != 0xffffffffffffffff)) &&
           (local_58.track != -1)) {
          __position._M_current =
               (this->indexes).
               super__Vector_base<MatroskaDemuxer::MatroskaDemuxIndex,_std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->indexes).
              super__Vector_base<MatroskaDemuxer::MatroskaDemuxIndex,_std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<MatroskaDemuxer::MatroskaDemuxIndex,std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>>
            ::_M_realloc_insert<MatroskaDemuxer::MatroskaDemuxIndex_const&>
                      (local_38,__position,&local_58);
          }
          else {
            (__position._M_current)->time = local_58.time;
            (__position._M_current)->pos = local_58.pos;
            (__position._M_current)->track = local_58.track;
            *(undefined6 *)&(__position._M_current)->field_0xa = local_58._10_6_;
            ppMVar1 = &(this->indexes).
                       super__Vector_base<MatroskaDemuxer::MatroskaDemuxIndex,_std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppMVar1 = *ppMVar1 + 1;
          }
        }
      }
    }
    iVar3 = *levelUp;
  } while (iVar3 == 0);
  *levelUp = iVar3 + -1;
  return iVar2;
}

Assistant:

int MatroskaDemuxer::matroska_parse_index()
{
    int res = 0;
    uint32_t id;
    MatroskaDemuxIndex idx{};

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* one single index entry ('point') */
        case MATROSKA_ID_POINTENTRY:
            if ((res = ebml_read_master(&id)) < 0)
                break;

            /* in the end, we hope to fill one entry with a
             * timestamp, a file position and a tracknum */
            idx.pos = ULLONG_MAX;
            idx.time = ULLONG_MAX;
            idx.track = -1;

            while (res == 0)
            {
                if ((id = ebml_peek_id(&level_up)) == 0)
                {
                    res = -BufferedReader::DATA_EOF;
                    break;
                }
                if (level_up)
                {
                    level_up--;
                    break;
                }

                switch (id)
                {
                /* one single index entry ('point') */
                case MATROSKA_ID_CUETIME:
                {
                    int64_t time;
                    if ((res = ebml_read_uint(&id, &time)) < 0)
                        break;
                    idx.time = time * time_scale;
                    break;
                }

                /* position in the file + track to which it
                 * belongs */
                case MATROSKA_ID_CUETRACKPOSITION:
                    if ((res = ebml_read_master(&id)) < 0)
                        break;

                    while (res == 0)
                    {
                        if ((id = ebml_peek_id(&level_up)) == 0)
                        {
                            res = -BufferedReader::DATA_EOF;
                            break;
                        }
                        if (level_up)
                        {
                            level_up--;
                            break;
                        }

                        switch (id)
                        {
                        /* track number */
                        case MATROSKA_ID_CUETRACK:
                        {
                            int64_t num;
                            if ((res = ebml_read_uint(&id, &num)) < 0)
                                break;
                            idx.track = static_cast<int16_t>(num);
                            break;
                        }

                        /* position in file */
                        case MATROSKA_ID_CUECLUSTERPOSITION:
                        {
                            int64_t num;
                            if ((res = ebml_read_uint(&id, &num)) < 0)
                                break;
                            idx.pos = num + segment_start;
                            break;
                        }
                        case EBML_ID_VOID:
                        case EBML_ID_CRC32:
                            res = ebml_read_skip();
                            break;
                        default:
                            res = ebml_read_skip();
                            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in CuesTrackPositions");
                        }

                        if (level_up)
                        {
                            level_up--;
                            break;
                        }
                    }
                    break;
                case EBML_ID_VOID:
                case EBML_ID_CRC32:
                    res = ebml_read_skip();
                    break;
                default:
                    res = ebml_read_skip();
                    LTRACE(LT_INFO, 0, "Unknown entry " << id << " in cuespoint index");
                }

                if (level_up)
                {
                    level_up--;
                    break;
                }
            }

            /* so let's see if we got what we wanted */
            if (idx.pos != ULLONG_MAX && idx.time != ULLONG_MAX && idx.track != -1)
            {
                indexes.push_back(idx);
            }
            break;
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in cues header");
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    return res;
}